

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorsTests.cpp
# Opt level: O3

void __thiscall VectorsTest_Int3Difference_Test::TestBody(VectorsTest_Int3Difference_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  AssertHelper AStack_48;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  int local_38 [2];
  internal local_30 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  undefined8 local_20;
  int local_18 [2];
  
  local_20 = &DAT_dfffffffd;
  local_18[0] = -4;
  local_40.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_dfffffffd;
  local_38[0] = -4;
  testing::internal::CmpHelperEQ<int,int>
            (local_30,"res.x","Int3(-3, 13, -4).x",(int *)&local_20,(int *)&local_40);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_28.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_28.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/VectorsTests.cpp"
               ,0x3f,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&AStack_48);
    if (local_40.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_40.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_40.ptr_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_40.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_dfffffffd;
    local_38[0] = -4;
    testing::internal::CmpHelperEQ<int,int>
              (local_30,"res.y","Int3(-3, 13, -4).y",(int *)((long)&local_20 + 4),
               (int *)((long)&local_40.ptr_ + 4));
    if (local_30[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_40);
      if (local_28.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((local_28.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&AStack_48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/VectorsTests.cpp"
                 ,0x3f,pcVar2);
      testing::internal::AssertHelper::operator=(&AStack_48,(Message *)&local_40);
      testing::internal::AssertHelper::~AssertHelper(&AStack_48);
      if (local_40.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_40.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_40.ptr_ + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_40.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_dfffffffd
      ;
      local_38[0] = -4;
      testing::internal::CmpHelperEQ<int,int>
                (local_30,"res.z","Int3(-3, 13, -4).z",local_18,local_38);
      if (local_30[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_40);
        if (local_28.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((local_28.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&AStack_48,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/VectorsTests.cpp"
                   ,0x3f,pcVar2);
        testing::internal::AssertHelper::operator=(&AStack_48,(Message *)&local_40);
        testing::internal::AssertHelper::~AssertHelper(&AStack_48);
        if (local_40.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_40.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_40.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
  }
  return;
}

Assistant:

TEST(VectorsTest, Int3Difference)
{
    Int3 v1(3, 5, -2), v2(6, -8, 2);
    Int3 res = v1 - v2;
    ASSERT_EQ_INT3(res, Int3(-3, 13, -4));
}